

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  allocator<char> local_399;
  string local_398;
  char *local_378;
  char *p;
  string propval;
  undefined1 local_348 [8];
  string prop_2;
  ostringstream local_308 [8];
  ostringstream m;
  allocator<char> local_189;
  undefined1 local_188 [8];
  string prop_1;
  string local_160;
  undefined1 local_140 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dummy;
  string local_120;
  cmLinkInterface *local_100;
  cmLinkInterface *iface;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0;
  string local_80 [8];
  string value;
  string prop;
  cmMakefile *mf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  string *suffix_local;
  string *config_local;
  cmExportFileGenerator *this_local;
  
  this_00 = target->Makefile;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (((TVar2 == SHARED_LIBRARY) ||
      (TVar2 = cmGeneratorTarget::GetType(target), TVar2 == MODULE_LIBRARY)) &&
     (bVar1 = cmGeneratorTarget::IsDLLPlatform(target), !bVar1)) {
    std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_80);
    bVar1 = cmGeneratorTarget::HasSOName(target,config);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_b1);
      bVar1 = cmMakefile::IsOn(this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      if (bVar1) {
        (*this->_vptr_cmExportFileGenerator[0x12])(local_d8,this,target,config);
        std::__cxx11::string::operator=(local_80,local_d8);
        std::__cxx11::string::~string(local_d8);
      }
      std::__cxx11::string::operator=((string *)(value.field_2._M_local_buf + 8),"IMPORTED_SONAME");
      cmGeneratorTarget::GetSOName((string *)&iface,target,config);
      std::__cxx11::string::operator+=(local_80,(string *)&iface);
      std::__cxx11::string::~string((string *)&iface);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)(value.field_2._M_local_buf + 8),"IMPORTED_NO_SONAME");
      std::__cxx11::string::operator=(local_80,"TRUE");
    }
    std::__cxx11::string::operator+=((string *)(value.field_2._M_local_buf + 8),(string *)suffix);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)((long)&value.field_2 + 8));
    std::__cxx11::string::operator=((string *)pmVar4,local_80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  }
  local_100 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (local_100 != (cmLinkInterface *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"IMPORTED_LINK_INTERFACE_LANGUAGES",
               (allocator<char> *)
               ((long)&dummy.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    SetImportLinkProperty<std::__cxx11::string>
              (this,suffix,target,&local_120,&local_100->Languages,properties,missingTargets);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dummy.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_140);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"IMPORTED_LINK_DEPENDENT_LIBRARIES",
               (allocator<char> *)(prop_1.field_2._M_local_buf + 0xf));
    SetImportLinkProperty<cmLinkItem>
              (this,suffix,target,&local_160,&local_100->SharedDeps,properties,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)(prop_1.field_2._M_local_buf + 0xf));
    if (local_100->Multiplicity != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_188,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",&local_189);
      std::allocator<char>::~allocator(&local_189);
      std::__cxx11::string::operator+=((string *)local_188,(string *)suffix);
      std::__cxx11::ostringstream::ostringstream(local_308);
      std::ostream::operator<<(local_308,local_100->Multiplicity);
      std::__cxx11::ostringstream::str();
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,(key_type *)local_188);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)(prop_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(prop_2.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_308);
      std::__cxx11::string::~string((string *)local_188);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_140);
  }
  MVar3 = cmGeneratorTarget::GetManagedType(target,config);
  if (MVar3 != Native) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_348,"IMPORTED_COMMON_LANGUAGE_RUNTIME",
               (allocator<char> *)(propval.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(propval.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_348,(string *)suffix);
    std::__cxx11::string::string((string *)&p);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"COMMON_LANGUAGE_RUNTIME",&local_399);
    pcVar5 = cmGeneratorTarget::GetProperty(target,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    local_378 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      bVar1 = cmGeneratorTarget::IsCSharpOnly(target);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&p,"CSharp");
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&p,pcVar5);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)local_348);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&p);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)local_348);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::vector<std::string>& missingTargets)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_INTERFACE_LANGUAGES",
                                iface->Languages, properties, missingTargets);

    std::vector<std::string> dummy;
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_DEPENDENT_LIBRARIES",
                                iface->SharedDeps, properties, dummy);
    if (iface->Multiplicity > 0) {
      std::string prop = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
      prop += suffix;
      std::ostringstream m;
      m << iface->Multiplicity;
      properties[prop] = m.str();
    }
  }

  // Add information if this target is a managed target
  if (target->GetManagedType(config) !=
      cmGeneratorTarget::ManagedType::Native) {
    std::string prop = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    prop += suffix;
    std::string propval;
    if (auto* p = target->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
      propval = p;
    } else if (target->IsCSharpOnly()) {
      // C# projects do not have the /clr flag, so we set the property
      // here to mark the target as (only) managed (i.e. no .lib file
      // to link to). Otherwise the  COMMON_LANGUAGE_RUNTIME target
      // property would have to be set manually for C# targets to make
      // exporting/importing work.
      propval = "CSharp";
    }
    properties[prop] = propval;
  }
}